

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::DCData::MXFReader::h__Reader::MD_to_DCData_DDesc
          (h__Reader *this,PrivateDCDataDescriptor *descriptor_object,DCDataDescriptor *DDesc)

{
  bool bVar1;
  unsigned_long_long *puVar2;
  byte_t *pbVar3;
  undefined8 *in_RCX;
  DCDataDescriptor *DDesc_local;
  PrivateDCDataDescriptor *descriptor_object_local;
  h__Reader *this_local;
  
  *in_RCX = *(undefined8 *)(DDesc[5].AssetID + 8);
  bVar1 = MXF::optional_property<unsigned_long_long>::empty
                    ((optional_property<unsigned_long_long> *)DDesc[5].DataEssenceCoding);
  if (!bVar1) {
    puVar2 = MXF::optional_property<unsigned_long_long>::const_get
                       ((optional_property<unsigned_long_long> *)DDesc[5].DataEssenceCoding);
    if (0xffffffff < *puVar2) {
      __assert_fail("descriptor_object.ContainerDuration.const_get() <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_DCData.cpp"
                    ,0x77,
                    "ASDCP::Result_t ASDCP::DCData::MXFReader::h__Reader::MD_to_DCData_DDesc(const MXF::PrivateDCDataDescriptor &, DCData::DCDataDescriptor &)"
                   );
    }
    puVar2 = MXF::optional_property<unsigned_long_long>::const_get
                       ((optional_property<unsigned_long_long> *)DDesc[5].DataEssenceCoding);
    *(int *)(in_RCX + 1) = (int)*puVar2;
  }
  pbVar3 = Kumu::Identifier<16U>::Value((Identifier<16U> *)DDesc[7].DataEssenceCoding);
  *(undefined8 *)((long)in_RCX + 0x1c) = *(undefined8 *)pbVar3;
  *(undefined8 *)((long)in_RCX + 0x24) = *(undefined8 *)(pbVar3 + 8);
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFReader::h__Reader::MD_to_DCData_DDesc(const MXF::PrivateDCDataDescriptor& descriptor_object,
							DCData::DCDataDescriptor& DDesc)
{
  DDesc.EditRate = descriptor_object.SampleRate;
  if ( ! descriptor_object.ContainerDuration.empty() )
    {
      assert(descriptor_object.ContainerDuration.const_get() <= 0xFFFFFFFFL);
      DDesc.ContainerDuration = static_cast<ui32_t>(descriptor_object.ContainerDuration.const_get());
    }
  memcpy(DDesc.DataEssenceCoding, descriptor_object.DataEssenceCoding.Value(), SMPTE_UL_LENGTH);
  return RESULT_OK;
}